

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xreq.c
# Opt level: O0

int nn_xreq_add(nn_sockbase *self,nn_pipe *pipe)

{
  void *data_00;
  nn_pipe *in_RSI;
  nn_lb_data *in_RDI;
  size_t sz;
  int rcvprio;
  int sndprio;
  nn_xreq_data *data;
  nn_xreq *xreq;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  undefined6 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc6;
  undefined1 uVar1;
  undefined1 in_stack_ffffffffffffffc7;
  undefined1 uVar2;
  long lVar3;
  nn_fq *self_00;
  int local_28;
  int local_24;
  
  if (in_RDI == (nn_lb_data *)0x0) {
    in_RDI = (nn_lb_data *)0x0;
  }
  lVar3 = 4;
  nn_pipe_getopt((nn_pipe *)0x4,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,
                 (void *)CONCAT17(in_stack_ffffffffffffffc7,
                                  CONCAT16(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc0)),
                 (size_t *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  if (lVar3 != 4) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","sz == sizeof (sndprio)",
            "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/protocols/reqrep/xreq.c"
            ,0x5e);
    fflush(_stderr);
    nn_err_abort();
  }
  uVar2 = 0 < local_24 && local_24 < 0x11;
  if (0 >= local_24 || local_24 >= 0x11) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","sndprio >= 1 && sndprio <= 16",
            "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/protocols/reqrep/xreq.c"
            ,0x5f);
    fflush(_stderr);
    nn_err_abort();
  }
  self_00 = (nn_fq *)0x4;
  nn_pipe_getopt((nn_pipe *)0x4,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,
                 (void *)CONCAT17(uVar2,CONCAT16(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc0
                                                )),
                 (size_t *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  if (self_00 == (nn_fq *)0x4) {
    uVar1 = 0 < local_28 && local_28 < 0x11;
    if (0 >= local_28 || local_28 >= 0x11) {
      nn_backtrace_print();
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","rcvprio >= 1 && rcvprio <= 16",
              "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/protocols/reqrep/xreq.c"
              ,100);
      fflush(_stderr);
      nn_err_abort();
    }
    data_00 = nn_alloc_(0x1302df);
    if (data_00 == (void *)0x0) {
      nn_backtrace_print();
      fprintf(_stderr,"Out of memory (%s:%d)\n",
              "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/protocols/reqrep/xreq.c"
              ,0x67);
      fflush(_stderr);
      nn_err_abort();
    }
    nn_pipe_setdata(in_RSI,data_00);
    nn_lb_add((nn_lb *)self_00,in_RDI,
              (nn_pipe *)CONCAT17(uVar2,CONCAT16(uVar1,in_stack_ffffffffffffffc0)),
              in_stack_ffffffffffffffbc);
    nn_fq_add(self_00,(nn_fq_data *)in_RDI,
              (nn_pipe *)CONCAT17(uVar2,CONCAT16(uVar1,in_stack_ffffffffffffffc0)),
              in_stack_ffffffffffffffbc);
    return 0;
  }
  nn_backtrace_print();
  fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","sz == sizeof (rcvprio)",
          "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/protocols/reqrep/xreq.c"
          ,99);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

int nn_xreq_add (struct nn_sockbase *self, struct nn_pipe *pipe)
{
    struct nn_xreq *xreq;
    struct nn_xreq_data *data;
    int sndprio;
    int rcvprio;
    size_t sz;

    xreq = nn_cont (self, struct nn_xreq, sockbase);

    sz = sizeof (sndprio);
    nn_pipe_getopt (pipe, NN_SOL_SOCKET, NN_SNDPRIO, &sndprio, &sz);
    nn_assert (sz == sizeof (sndprio));
    nn_assert (sndprio >= 1 && sndprio <= 16);

    sz = sizeof (rcvprio);
    nn_pipe_getopt (pipe, NN_SOL_SOCKET, NN_RCVPRIO, &rcvprio, &sz);
    nn_assert (sz == sizeof (rcvprio));
    nn_assert (rcvprio >= 1 && rcvprio <= 16);

    data = nn_alloc (sizeof (struct nn_xreq_data), "pipe data (req)");
    alloc_assert (data);
    nn_pipe_setdata (pipe, data);
    nn_lb_add (&xreq->lb, &data->lb, pipe, sndprio);
    nn_fq_add (&xreq->fq, &data->fq, pipe, rcvprio);

    return 0;
}